

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

int __thiscall QHeaderView::visualIndex(QHeaderView *this,int logicalIndex)

{
  bool bVar1;
  int iVar2;
  QHeaderViewPrivate *this_00;
  QList<int> *this_01;
  qsizetype qVar3;
  const_reference piVar4;
  int in_ESI;
  int visual;
  QHeaderViewPrivate *d;
  qsizetype in_stack_ffffffffffffffb8;
  QHeaderViewPrivate *in_stack_ffffffffffffffc0;
  int local_4;
  
  this_00 = d_func((QHeaderView *)0x835fe0);
  if (in_ESI < 0) {
    local_4 = -1;
  }
  else {
    QAbstractItemViewPrivate::executePostedLayout
              (&in_stack_ffffffffffffffc0->super_QAbstractItemViewPrivate);
    iVar2 = count((QHeaderView *)in_stack_ffffffffffffffc0);
    if (in_ESI < iVar2) {
      bVar1 = QHeaderViewPrivate::noSectionMemoryUsage(this_00);
      local_4 = in_ESI;
      if (!bVar1) {
        bVar1 = QList<int>::isEmpty((QList<int> *)0x83605a);
        if (bVar1) {
          iVar2 = QHeaderViewPrivate::sectionCount(in_stack_ffffffffffffffc0);
          if (in_ESI < iVar2) {
            return in_ESI;
          }
        }
        else {
          this_01 = (QList<int> *)(long)in_ESI;
          qVar3 = QList<int>::size(&this_00->visualIndices);
          if ((long)this_01 < qVar3) {
            piVar4 = QList<int>::at(this_01,in_stack_ffffffffffffffb8);
            return *piVar4;
          }
        }
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int QHeaderView::visualIndex(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (logicalIndex < 0)
        return -1;
    d->executePostedLayout();

    if (logicalIndex >= count())
        return -1;

    if (d->noSectionMemoryUsage())
        return logicalIndex;

    if (d->visualIndices.isEmpty()) { // nothing has been moved, so we have no mapping
        if (logicalIndex < d->sectionCount())
            return logicalIndex;
    } else if (logicalIndex < d->visualIndices.size()) {
        int visual = d->visualIndices.at(logicalIndex);
        Q_ASSERT(visual < d->sectionCount());
        return visual;
    }
    return -1;
}